

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_gc(lua_State *L,int what,int data)

{
  lu_byte lVar1;
  global_State *g_00;
  long lStack_30;
  lu_byte oldrunning;
  l_mem debt;
  global_State *g;
  int local_18;
  int res;
  int data_local;
  int what_local;
  lua_State *L_local;
  
  g._4_4_ = 0;
  g_00 = L->l_G;
  switch(what) {
  case 0:
    g_00->gcrunning = '\0';
    break;
  case 1:
    luaE_setdebt(g_00,0);
    g_00->gcrunning = '\x01';
    break;
  case 2:
    luaC_fullgc(L,0);
    break;
  case 3:
    g._4_4_ = (uint)((ulong)(g_00->totalbytes + g_00->GCdebt) >> 10);
    break;
  case 4:
    g._4_4_ = (int)g_00->totalbytes + (int)g_00->GCdebt & 0x3ff;
    break;
  case 5:
    lStack_30 = 1;
    lVar1 = g_00->gcrunning;
    g_00->gcrunning = '\x01';
    if (data == 0) {
      luaE_setdebt(g_00,-0x960);
      luaC_step(L);
    }
    else {
      lStack_30 = (long)data * 0x400 + g_00->GCdebt;
      luaE_setdebt(g_00,lStack_30);
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
    }
    g_00->gcrunning = lVar1;
    if ((0 < lStack_30) && (g_00->gcstate == '\a')) {
      g._4_4_ = 1;
    }
    break;
  case 6:
    g._4_4_ = g_00->gcpause;
    g_00->gcpause = data;
    break;
  case 7:
    g._4_4_ = g_00->gcstepmul;
    local_18 = data;
    if (data < 0x28) {
      local_18 = 0x28;
    }
    g_00->gcstepmul = local_18;
    break;
  default:
    g._4_4_ = 0xffffffff;
    break;
  case 9:
    g._4_4_ = (uint)g_00->gcrunning;
  }
  return g._4_4_;
}

Assistant:

LUA_API int lua_gc(lua_State *L, int what, int data) {
    int res = 0;
    global_State *g;
    lua_lock(L);
    g = G(L);
    switch (what) {
        case LUA_GCSTOP: {
            g->gcrunning = 0;
            break;
        }
        case LUA_GCRESTART: {
            luaE_setdebt(g, 0);
            g->gcrunning = 1;
            break;
        }
        case LUA_GCCOLLECT: {
            luaC_fullgc(L, 0);
            break;
        }
        case LUA_GCCOUNT: {
            /* GC values are expressed in Kbytes: #bytes/2^10 */
            res = cast_int(gettotalbytes(g) >> 10);
            break;
        }
        case LUA_GCCOUNTB: {
            res = cast_int(gettotalbytes(g) & 0x3ff);
            break;
        }
        case LUA_GCSTEP: {
            l_mem debt = 1;  /* =1 to signal that it did an actual step */
            lu_byte oldrunning = g->gcrunning;
            g->gcrunning = 1;  /* allow GC to run */
            if (data == 0) {
                luaE_setdebt(g, -GCSTEPSIZE);  /* to do a "small" step */
                luaC_step(L);
            } else {  /* add 'data' to total debt */
                debt = cast(l_mem, data) * 1024 + g->GCdebt;
                luaE_setdebt(g, debt);
                luaC_checkGC(L);
            }
            g->gcrunning = oldrunning;  /* restore previous state */
            if (debt > 0 && g->gcstate == GCSpause)  /* end of cycle? */
                res = 1;  /* signal it */
            break;
        }
        case LUA_GCSETPAUSE: {
            res = g->gcpause;
            g->gcpause = data;
            break;
        }
        case LUA_GCSETSTEPMUL: {
            res = g->gcstepmul;
            if (data < 40) data = 40;  /* avoid ridiculous low values (and 0) */
            g->gcstepmul = data;
            break;
        }
        case LUA_GCISRUNNING: {
            res = g->gcrunning;
            break;
        }
        default:
            res = -1;  /* invalid option */
    }
    lua_unlock(L);
    return res;
}